

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::MaxTempDirectorySizeSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  int iVar1;
  DBConfig *pDVar2;
  BufferManager *pBVar3;
  undefined4 extraout_var;
  StringUtil *pSVar4;
  idx_t in_RCX;
  _func_int **multiplier;
  string *this;
  optional_idx max_swap;
  optional_idx local_58;
  string local_50;
  string local_30;
  
  pDVar2 = DBConfig::GetConfig(context);
  pSVar4 = (StringUtil *)(pDVar2->options).maximum_swap_space;
  if (pSVar4 == (StringUtil *)0xffffffffffffffff) {
    pBVar3 = BufferManager::GetBufferManager(context);
    multiplier = pBVar3->_vptr_BufferManager;
    iVar1 = (*multiplier[0xd])(pBVar3);
    local_58.index = CONCAT44(extraout_var,iVar1);
    if (local_58.index == 0xffffffffffffffff) {
      Value::Value(__return_storage_ptr__,"90% of available disk space");
      return __return_storage_ptr__;
    }
    pSVar4 = (StringUtil *)optional_idx::GetIndex(&local_58);
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,pSVar4,0x400,(idx_t)multiplier);
    Value::Value(__return_storage_ptr__,(string *)&local_50);
    this = &local_50;
  }
  else {
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_30,pSVar4,0x400,in_RCX);
    Value::Value(__return_storage_ptr__,(string *)&local_30);
    this = &local_30;
  }
  ::std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Value MaxTempDirectorySizeSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	if (config.options.maximum_swap_space != DConstants::INVALID_INDEX) {
		// Explicitly set by the user
		return Value(StringUtil::BytesToHumanReadableString(config.options.maximum_swap_space));
	}
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	// Database is initialized, use the setting from the temporary directory
	auto max_swap = buffer_manager.GetMaxSwap();
	if (max_swap.IsValid()) {
		return Value(StringUtil::BytesToHumanReadableString(max_swap.GetIndex()));
	} else {
		// The temp directory has not been used yet
		return Value("90% of available disk space");
	}
}